

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineLargeContiguousImpl32
                   (uint64_t state,uchar *first,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  if (0x3ff < len) {
    do {
      uVar3 = CityHash32((char *)first,0x400);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3 ^ state;
      state = SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8) ^
              SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0);
      len = len - 0x400;
      first = (uchar *)((long)first + 0x400);
    } while (0x3ff < len);
  }
  if (len < 9) {
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar6 = (ulong)*(byte *)((long)first + (len - 1)) | (ulong)(byte)*(uint *)first << 0x10;
      uVar4 = (ulong)*(byte *)((long)first + (len >> 1)) << 8;
    }
    else {
      uVar6 = (ulong)*(uint *)first << 0x20;
      uVar4 = (ulong)*(uint *)((long)first + (len - 4));
    }
    uVar4 = ((uVar4 | uVar6) ^ state) * -0x234dd359734ecb13;
    uVar5 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  }
  else {
    uVar3 = CityHash32((char *)first,len);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = state ^ uVar3;
    uVar5 = SUB168(auVar2 * ZEXT816(0xdcb22ca68cb134ed),8) ^
            SUB168(auVar2 * ZEXT816(0xdcb22ca68cb134ed),0);
  }
  return uVar5;
}

Assistant:

uint64_t MixingHashState::CombineLargeContiguousImpl32(
    uint64_t state, const unsigned char* first, size_t len) {
  while (len >= PiecewiseChunkSize()) {
    state = Mix(
        state ^ hash_internal::CityHash32(reinterpret_cast<const char*>(first),
                                          PiecewiseChunkSize()),
        kMul);
    len -= PiecewiseChunkSize();
    first += PiecewiseChunkSize();
  }
  // Handle the remainder.
  return CombineContiguousImpl(state, first, len,
                               std::integral_constant<int, 4>{});
}